

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scv.c
# Opt level: O1

void * scv_at(scv_vector *v,size_t i)

{
  void *pvVar1;
  
  if (v == (scv_vector *)0x0) {
    __assert_fail("v != NULL","/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c"
                  ,0x98,"void *scv_at(struct scv_vector *, size_t)");
  }
  if (v->data != (void *)0x0) {
    if (i < v->size) {
      pvVar1 = (void *)((long)v->data + i * v->objsize);
    }
    else {
      pvVar1 = (void *)0x0;
    }
    return pvVar1;
  }
  __assert_fail("v->data != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x99,
                "void *scv_at(struct scv_vector *, size_t)");
}

Assistant:

void *scv_at(struct scv_vector *v, size_t i)
{
	assert(v != NULL);
	assert(v->data != NULL);

	if (i >= v->size) {
		return NULL;
	}

	return SCV_AT(v, i);
}